

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackContainer.h
# Opt level: O0

void __thiscall
slang::
StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>::
deallocate(StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>
           *this,sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *p,size_t n)

{
  size_t __x;
  bool bVar1;
  sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *psVar2;
  bool local_39;
  less<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>_*> local_22;
  less_equal<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>_*>
  local_21;
  size_t local_20;
  size_t n_local;
  sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *p_local;
  StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>
  *this_local;
  
  local_20 = n;
  n_local = (size_t)p;
  p_local = (sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *)this;
  psVar2 = StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>
           ::getBuffer(this->storage);
  bVar1 = std::
          less_equal<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>_*>
          ::operator()(&local_21,psVar2,
                       (sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *)n_local);
  __x = n_local;
  local_39 = false;
  if (bVar1) {
    psVar2 = StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>
             ::getBuffer(this->storage);
    local_39 = std::
               less<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>_*>
               ::operator()(&local_22,
                            (sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *)__x,
                            psVar2 + 0x10);
  }
  if (local_39 == false) {
    operator_delete((void *)n_local);
  }
  else if ((sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *)
           (n_local + local_20 * 0x18) == this->storage->ptr) {
    this->storage->ptr = (sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_> *)n_local;
  }
  return;
}

Assistant:

void deallocate(T* p, std::size_t n) noexcept {
        // If the pointer is in our buffer, possibly "deallocate" by moving the high water mark
        // back. Otherwise it was heap allocated and we must free with delete.
        if (std::less_equal<T*>()(storage->getBuffer(), p) &&
            std::less<T*>()(p, storage->getBuffer() + N)) {
            if (p + n == storage->ptr)
                storage->ptr = p;
        }
        else {
            ::operator delete(p);
        }
    }